

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_getAlias_63(char *alias,uint16_t n,UErrorCode *pErrorCode)

{
  char *pcVar1;
  UErrorCode *pErrorCode_local;
  uint16_t n_local;
  char *alias_local;
  
  pcVar1 = ucnv_io_getAlias(alias,n,pErrorCode);
  return pcVar1;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_getAlias(const char *alias, uint16_t n, UErrorCode *pErrorCode)
{
    return ucnv_io_getAlias(alias, n, pErrorCode);
}